

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestmemberCount::runTestCase(TestValueTestmemberCount *this)

{
  long in_RDI;
  PredicateContext _minitest_Context_11;
  PredicateContext _minitest_Context_10;
  PredicateContext _minitest_Context_9;
  PredicateContext _minitest_Context_8;
  PredicateContext _minitest_Context_7;
  PredicateContext _minitest_Context_6;
  PredicateContext _minitest_Context_5;
  PredicateContext _minitest_Context_4;
  PredicateContext _minitest_Context_3;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  undefined4 local_248 [2];
  char *local_240;
  undefined4 local_238;
  char *local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined4 local_218 [2];
  char *local_210;
  undefined4 local_208;
  char *local_200;
  undefined8 local_1f8;
  undefined8 in_stack_fffffffffffffe10;
  uint expectedCount;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffe1c;
  ValueTest *in_stack_fffffffffffffe20;
  char *this_00;
  undefined4 local_1b8 [2];
  char *local_1b0;
  undefined4 local_1a8;
  char *local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined4 local_188 [2];
  char *local_180;
  undefined4 local_178;
  char *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_158 [2];
  char *local_150;
  undefined4 local_148;
  char *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined4 local_128 [2];
  char *local_120;
  undefined4 local_118;
  char *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8 [2];
  char *local_f0;
  undefined4 local_e8;
  char *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8 [2];
  char *local_c0;
  undefined4 local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98 [2];
  char *local_90;
  undefined4 local_88;
  char *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined4 local_68 [2];
  char *local_60;
  undefined4 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38 [2];
  char *local_30;
  undefined4 local_28;
  char *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_38[0] = **(undefined4 **)(in_RDI + 8);
  local_30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_28 = 0x95;
  local_20 = "checkMemberCount(emptyArray_, 0)";
  local_18 = 0;
  local_10 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_38;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_38;
  expectedCount = (uint)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_68[0] = **(undefined4 **)(in_RDI + 8);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_58 = 0x96;
  local_50 = "checkMemberCount(emptyObject_, 0)";
  local_48 = 0;
  local_40 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_68;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_68;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_98[0] = **(undefined4 **)(in_RDI + 8);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_88 = 0x97;
  local_80 = "checkMemberCount(array1_, 1)";
  local_78 = 0;
  local_70 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_98;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_98;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_c8[0] = **(undefined4 **)(in_RDI + 8);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_b8 = 0x98;
  local_b0 = "checkMemberCount(object1_, 1)";
  local_a8 = 0;
  local_a0 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_c8;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_c8;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_f8[0] = **(undefined4 **)(in_RDI + 8);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_e8 = 0x99;
  local_e0 = "checkMemberCount(null_, 0)";
  local_d8 = 0;
  local_d0 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_f8;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_f8;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_128[0] = **(undefined4 **)(in_RDI + 8);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_118 = 0x9a;
  local_110 = "checkMemberCount(integer_, 0)";
  local_108 = 0;
  local_100 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_128;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_128;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_158[0] = **(undefined4 **)(in_RDI + 8);
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_148 = 0x9b;
  local_140 = "checkMemberCount(unsignedInteger_, 0)";
  local_138 = 0;
  local_130 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_158;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_158;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_188[0] = **(undefined4 **)(in_RDI + 8);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_178 = 0x9c;
  local_170 = "checkMemberCount(smallUnsignedInteger_, 0)";
  local_168 = 0;
  local_160 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_188;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_188;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_1b8[0] = **(undefined4 **)(in_RDI + 8);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1a8 = 0x9d;
  local_1a0 = "checkMemberCount(real_, 0)";
  local_198 = 0;
  local_190 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_1b8;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_1b8;
  ValueTest::checkMemberCount
            (in_stack_fffffffffffffe20,
             (Value *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  uVar1 = **(undefined4 **)(in_RDI + 8);
  this_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  *(undefined1 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = &stack0xfffffffffffffe18;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined1 **)(*(long *)(in_RDI + 8) + 8) = &stack0xfffffffffffffe18;
  ValueTest::checkMemberCount
            ((ValueTest *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,(Value *)CONCAT44(in_stack_fffffffffffffe1c,uVar1),expectedCount);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_218[0] = **(undefined4 **)(in_RDI + 8);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_208 = 0x9f;
  local_200 = "checkMemberCount(string_, 0)";
  local_1f8 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_218;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_218;
  ValueTest::checkMemberCount
            ((ValueTest *)this_00,(Value *)CONCAT44(in_stack_fffffffffffffe1c,uVar1),0);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  local_248[0] = **(undefined4 **)(in_RDI + 8);
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_238 = 0xa0;
  local_230 = "checkMemberCount(true_, 0)";
  local_228 = 0;
  local_220 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_248;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_248;
  ValueTest::checkMemberCount
            ((ValueTest *)this_00,(Value *)CONCAT44(in_stack_fffffffffffffe1c,uVar1),0);
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, memberCount) {
  JSONTEST_ASSERT_PRED(checkMemberCount(emptyArray_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(emptyObject_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(array1_, 1));
  JSONTEST_ASSERT_PRED(checkMemberCount(object1_, 1));
  JSONTEST_ASSERT_PRED(checkMemberCount(null_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(integer_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(unsignedInteger_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(smallUnsignedInteger_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(real_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(emptyString_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(string_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(true_, 0));
}